

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::FboTestUtil::TextureCubeArrayShader::shadeVertices
          (TextureCubeArrayShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  anon_union_64_6_e32bd5e8_for_value *paVar2;
  float *pfVar3;
  float *pfVar4;
  ulong uVar5;
  long lVar6;
  int col;
  long lVar7;
  float v_1;
  float fVar8;
  Vec4 v;
  Vec3 v_coord;
  Mat3 texCoordMat;
  Vec4 local_88;
  undefined8 local_70;
  deUint32 local_68;
  VertexPacket **local_60;
  float local_58 [10];
  
  paVar2 = &((this->super_ShaderProgram).m_uniforms.
             super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
             super__Vector_impl_data._M_start)->value;
  pfVar3 = local_58;
  local_58[4] = 0.0;
  local_58[5] = 0.0;
  local_58[6] = 0.0;
  local_58[7] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  local_58[8] = 0.0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    pfVar4 = pfVar3;
    do {
      *pfVar4 = (float)paVar2->i4[lVar7];
      lVar7 = lVar7 + 1;
      pfVar4 = pfVar4 + 3;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    pfVar3 = pfVar3 + 1;
    paVar2 = (anon_union_64_6_e32bd5e8_for_value *)((long)paVar2 + 0xc);
  } while (lVar6 != 3);
  if (0 < numPackets) {
    uVar5 = 0;
    local_60 = packets;
    do {
      pVVar1 = local_60[uVar5];
      local_88.m_data[0] = 0.0;
      local_88.m_data[1] = 0.0;
      local_88.m_data[2] = 0.0;
      local_88.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_88,inputs + 1,pVVar1->instanceNdx,pVVar1->vertexNdx);
      local_88.m_data[2] = 1.0;
      local_70 = 0;
      local_68 = 0;
      pfVar3 = local_58;
      lVar6 = 0;
      do {
        fVar8 = 0.0;
        lVar7 = 0;
        pfVar4 = pfVar3;
        do {
          fVar8 = fVar8 + *pfVar4 * local_88.m_data[lVar7];
          lVar7 = lVar7 + 1;
          pfVar4 = pfVar4 + 3;
        } while (lVar7 != 3);
        *(float *)((long)&local_70 + lVar6 * 4) = fVar8;
        lVar6 = lVar6 + 1;
        pfVar3 = pfVar3 + 1;
      } while (lVar6 != 3);
      local_88.m_data[0] = 0.0;
      local_88.m_data[1] = 0.0;
      local_88.m_data[2] = 0.0;
      local_88.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_88,inputs,pVVar1->instanceNdx,pVVar1->vertexNdx);
      *(undefined8 *)(pVVar1->position).m_data = local_88.m_data._0_8_;
      *(undefined8 *)((pVVar1->position).m_data + 2) = local_88.m_data._8_8_;
      *(undefined8 *)&pVVar1->outputs[0].v = local_70;
      pVVar1->outputs[0].v.uData[2] = local_68;
      pVVar1->outputs[0].v.uData[3] = 0;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)numPackets);
  }
  return;
}

Assistant:

void TextureCubeArrayShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	tcu::Mat3 texCoordMat = tcu::Mat3(m_uniforms[0].value.m3);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::VertexPacket&	packet	= *packets[packetNdx];
		const tcu::Vec2		a_coord = rr::readVertexAttribFloat(inputs[1], packet.instanceNdx, packet.vertexNdx).xy();
		const tcu::Vec3		v_coord = texCoordMat * tcu::Vec3(a_coord.x(), a_coord.y(), 1.0f);

		packet.position = rr::readVertexAttribFloat(inputs[0], packet.instanceNdx, packet.vertexNdx);
		packet.outputs[0] = tcu::Vec4(v_coord.x(), v_coord.y(), v_coord.z(), 0.0f);
	}
}